

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRectangularPyramid::IfcRectangularPyramid(IfcRectangularPyramid *this)

{
  IfcRectangularPyramid *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x60,"IfcRectangularPyramid");
  IfcCsgPrimitive3D::IfcCsgPrimitive3D
            (&this->super_IfcCsgPrimitive3D,&PTR_construction_vtable_24__00f8af88);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangularPyramid,_3UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRectangularPyramid,_3UL> *)
             &(this->super_IfcCsgPrimitive3D).field_0x38,&PTR_construction_vtable_24__00f8b000);
  (this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf8aed0;
  *(undefined8 *)&this->field_0x60 = 0xf8af70;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf8aef8;
  *(undefined8 *)
   &(this->super_IfcCsgPrimitive3D).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem
    .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf8af20;
  *(undefined8 *)&(this->super_IfcCsgPrimitive3D).field_0x38 = 0xf8af48;
  return;
}

Assistant:

IfcRectangularPyramid() : Object("IfcRectangularPyramid") {}